

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

any __thiscall
cs_impl::any::
make_constant<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>const&>
          (any *this,_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *args)

{
  _Elt_pointer paVar1;
  _Map_pointer ppaVar2;
  baseHolder *pbVar3;
  proxy *ppVar4;
  
  if ((DAT_0026a760 == 0) || (cs::global_thread_counter != 0)) {
    pbVar3 = (baseHolder *)operator_new(0x28);
  }
  else {
    pbVar3 = *(baseHolder **)(&init_extensions()::extensions_initiator + DAT_0026a760 * 8);
    DAT_0026a760 = DAT_0026a760 + -1;
  }
  pbVar3->_vptr_baseHolder = (_func_int **)&PTR__baseHolder_0025f480;
  paVar1 = args->_M_first;
  pbVar3[1]._vptr_baseHolder = (_func_int **)args->_M_cur;
  pbVar3[2]._vptr_baseHolder = (_func_int **)paVar1;
  ppaVar2 = args->_M_node;
  pbVar3[3]._vptr_baseHolder = (_func_int **)args->_M_last;
  pbVar3[4]._vptr_baseHolder = (_func_int **)ppaVar2;
  if ((DAT_002680d0 == 0) || (cs::global_thread_counter != 0)) {
    ppVar4 = (proxy *)operator_new(0x18);
  }
  else {
    ppVar4 = (proxy *)(&cs::null_pointer)[DAT_002680d0];
    DAT_002680d0 = DAT_002680d0 + -1;
  }
  ppVar4->is_rvalue = false;
  ppVar4->protect_level = 2;
  ppVar4->refcount = 1;
  ppVar4->data = pbVar3;
  this->mDat = ppVar4;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}